

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int floatx80_unordered_quiet_mips64(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  int iVar2;
  floatx80 a_00;
  
  if (((long)a.low < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
     && ((long)b.low < 0 ||
         ((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
         (a.high & 0x7fff) != 0x7fff) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        (b.high & 0x7fff) != 0x7fff)) {
      return 0;
    }
    iVar2 = floatx80_is_signaling_nan_mips64(a,status);
    if ((iVar2 == 0) &&
       (auVar1 = b._0_12_, a_00._12_4_ = 0, a_00.low = auVar1._0_8_, a_00.high = auVar1._8_2_,
       a_00._10_2_ = auVar1._10_2_, iVar2 = floatx80_is_signaling_nan_mips64(a_00,status),
       iVar2 == 0)) {
      return 1;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 1;
}

Assistant:

int floatx80_unordered_quiet(floatx80 a, floatx80 b, float_status *status)
{
    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    if (    (    ( extractFloatx80Exp( a ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( a )<<1 ) )
         || (    ( extractFloatx80Exp( b ) == 0x7FFF )
              && (uint64_t) ( extractFloatx80Frac( b )<<1 ) )
       ) {
        if (floatx80_is_signaling_nan(a, status)
         || floatx80_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}